

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

Var __thiscall
Js::TypedArray<short,_false,_false>::BaseTypedDirectGetItemNoDetachCheck
          (TypedArray<short,_false,_false> *this,uint32 index)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x142,"(!IsDetachedBuffer())","!IsDetachedBuffer()");
    if (!bVar3) goto LAB_00d7dbaa;
    *puVar5 = 0;
  }
  if ((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x143,"(index < GetLength())","index < GetLength()");
    if (!bVar3) goto LAB_00d7dbaa;
    *puVar5 = 0;
  }
  uVar1 = (this->super_TypedArrayBase).byteOffset;
  uVar4 = (*(((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->
            super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar4 < (ulong)uVar1 + (ulong)(index + 1) * 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x144,
                                "((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                ,
                                "(index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                               );
    if (!bVar3) {
LAB_00d7dbaa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return (Var)((ulong)(uint)(int)*(short *)((this->super_TypedArrayBase).buffer + (ulong)index * 2)
              | 0x1000000000000);
}

Assistant:

inline Var BaseTypedDirectGetItemNoDetachCheck(__in uint32 index)
        {
            Assert(!IsDetachedBuffer());
            Assert(index < GetLength());
            Assert((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            TypeName* typedBuffer = (TypeName*)buffer;
            return JavascriptNumber::ToVar(typedBuffer[index], GetScriptContext());
        }